

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O1

void __thiscall customCountUnits_testAllInv_Test::TestBody(customCountUnits_testAllInv_Test *this)

{
  uint uVar1;
  uint uVar2;
  unit_data uVar3;
  int iVar4;
  long lVar5;
  pointer *__ptr;
  char *in_R9;
  int iVar6;
  bool bVar7;
  AssertionResult gtest_ar__6;
  precise_unit cunit3;
  precise_unit cunit2;
  precise_unit cunit1;
  AssertHelper local_a8;
  internal local_a0;
  undefined7 uStack_9f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  string local_90;
  undefined1 local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  undefined1 local_60 [8];
  undefined8 local_58;
  AssertHelper local_50;
  precise_unit local_48;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  
  iVar6 = 0;
  lVar5 = 0;
  do {
    uVar1 = (((uint)lVar5 & 7) << 0x18 | 0xc00) << 4 | 0x50000;
    uVar1 = (uVar1 >> 2 & 0x10013000) + (uVar1 & 0x30010000) * 4;
    uVar1 = (uVar1 >> 1 & 0x40001000) + (uVar1 & 0x50051000) * 2 >> 1;
    local_48._8_8_ = ZEXT48(uVar1 | iVar6 >> 0x11 & 0xc000U);
    local_48.multiplier_ = 1.0;
    if ((uVar1 & 0x3800) == 0x1800) {
      local_60[0] = (uVar1 & 0x180000) != 0x100000;
      local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_60[0]) goto LAB_00146c0c;
    }
    else {
      local_60 = (undefined1  [8])((ulong)(uint7)local_60._1_7_ << 8);
LAB_00146c0c:
      local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)local_70);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_90,(internal *)local_60,
                 (AssertionResult *)"precise::custom::is_custom_count_unit(cunit1.base_units())",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x456,local_90._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)local_70);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (local_70 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_70 + 8))();
      }
    }
    if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_58,local_58);
    }
    bVar7 = ((uint)local_48.base_units_ & 0x73800) != 0x32800;
    local_60[0] = bVar7;
    local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!bVar7) {
      testing::Message::Message((Message *)local_70);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_90,(internal *)local_60,
                 (AssertionResult *)
                 "precise::custom::is_custom_count_unit_inverted( cunit1.base_units())","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x459,local_90._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)local_70);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )local_70 !=
          (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )0x0) {
        (**(code **)(*(long *)local_70 + 8))();
      }
    }
    if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_58,local_58);
    }
    if (((uint)local_48.base_units_ & 0x180000) == 0x100000) {
      uVar2 = ((int)local_48.base_units_ << 0x12) >> 0x1d;
      uVar1 = -uVar2;
      if (0 < (int)uVar2) {
        uVar1 = uVar2;
      }
      local_60[0] = uVar1 < 2;
      local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (uVar1 >= 2) {
        testing::Message::Message((Message *)local_70);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_90,(internal *)local_60,
                   (AssertionResult *)"precise::custom::is_custom_unit(cunit1.base_units())","true",
                   "false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                   ,0x45b,local_90._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)local_70);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if (local_70 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_70 + 8))();
        }
      }
    }
    else {
      local_60[0] = 1;
      local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_58,local_58);
    }
    local_38._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (1.0 / local_48.multiplier_);
    uVar3 = units::detail::unit_data::inv(&local_48.base_units_);
    uVar1 = ~local_48.commodity_;
    if (local_48.commodity_ == 0) {
      uVar1 = 0;
    }
    local_58._4_4_ = uVar1;
    local_58._0_4_ = uVar3;
    local_60 = (undefined1  [8])local_38._M_head_impl;
    iVar4 = ((int)uVar3 << 0xd) >> 0x1d;
    if (iVar4 == 3) {
      if (((uint)uVar3 & 0x3800) == 0x2800) goto LAB_00146ee7;
LAB_00146ec7:
      local_70 = (undefined1  [8])((ulong)(uint7)local_70._1_7_ << 8);
LAB_00146f05:
      local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)&local_a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_90,(internal *)local_70,
                 (AssertionResult *)"precise::custom::is_custom_count_unit(cunit2.base_units())",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x45d,local_90._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((long *)CONCAT71(uStack_9f,local_a0) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(uStack_9f,local_a0) + 8))();
      }
    }
    else {
      if ((iVar4 != -3) || (((uint)uVar3 & 0x3800) != 0x1800)) goto LAB_00146ec7;
LAB_00146ee7:
      local_70[0] = ((uint)uVar3 & 0x180000) != 0x100000;
      local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_70[0]) goto LAB_00146f05;
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    bVar7 = ((uint)local_58._0_4_ & 0x73800) == 0x32800;
    local_70[0] = bVar7;
    local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!bVar7) {
      testing::Message::Message((Message *)&local_a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_90,(internal *)local_70,
                 (AssertionResult *)
                 "precise::custom::is_custom_count_unit_inverted( cunit2.base_units())","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x460,local_90._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((long *)CONCAT71(uStack_9f,local_a0) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(uStack_9f,local_a0) + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    if (((uint)local_58._0_4_ & 0x180000) == 0x100000) {
      uVar2 = ((int)local_58._0_4_ << 0x12) >> 0x1d;
      uVar1 = -uVar2;
      if (0 < (int)uVar2) {
        uVar1 = uVar2;
      }
      local_70[0] = uVar1 < 2;
      local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (uVar1 >= 2) {
        testing::Message::Message((Message *)&local_a0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_90,(internal *)local_70,
                   (AssertionResult *)"precise::custom::is_custom_unit(cunit2.base_units())","true",
                   "false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                   ,0x461,local_90._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_a0);
        testing::internal::AssertHelper::~AssertHelper(&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if ((long *)CONCAT71(uStack_9f,local_a0) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(uStack_9f,local_a0) + 8))();
        }
      }
    }
    else {
      local_70[0] = 1;
      local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    local_38._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (1.0 / (double)local_60);
    uVar3 = units::detail::unit_data::inv((unit_data *)&local_58);
    uVar1 = ~local_58._4_4_;
    if (local_58._4_4_ == 0) {
      uVar1 = 0;
    }
    local_68._4_4_ = uVar1;
    local_68._0_4_ = uVar3;
    local_70 = (undefined1  [8])local_38._M_head_impl;
    iVar4 = ((int)uVar3 << 0xd) >> 0x1d;
    if (iVar4 == 3) {
      if (((uint)uVar3 & 0x3800) == 0x2800) goto LAB_001471d4;
LAB_001471b4:
      local_a0 = (internal)0x0;
LAB_001471f2:
      local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)&local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_90,&local_a0,
                 (AssertionResult *)"precise::custom::is_custom_count_unit(cunit3.base_units())",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x463,local_90._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (local_a8.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_a8.data_ + 8))();
      }
    }
    else {
      if ((iVar4 != -3) || (((uint)uVar3 & 0x3800) != 0x1800)) goto LAB_001471b4;
LAB_001471d4:
      local_a0 = (internal)(((uint)uVar3 & 0x180000) != 0x100000);
      local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_a0) goto LAB_001471f2;
    }
    if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_98,local_98);
    }
    local_a0 = (internal)(((uint)local_68._0_4_ & 0x73800) != 0x32800);
    local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_a0) {
      testing::Message::Message((Message *)&local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_90,&local_a0,
                 (AssertionResult *)
                 "precise::custom::is_custom_count_unit_inverted( cunit3.base_units())","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x466,local_90._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (local_a8.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_a8.data_ + 8))();
      }
    }
    if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_98,local_98);
    }
    bVar7 = units::precise_unit::operator==(&local_48,(precise_unit *)local_60);
    local_a0 = (internal)!bVar7;
    local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_a0) {
      testing::Message::Message((Message *)&local_a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(local_a8.data_)->line,"Error with false comparison 1 index ",0x24);
      std::ostream::_M_insert<unsigned_long>((ulong)&(local_a8.data_)->line);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_90,&local_a0,(AssertionResult *)"cunit1 == cunit2","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x468,local_90._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (local_a8.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_a8.data_ + 8))();
      }
    }
    if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_98,local_98);
    }
    bVar7 = units::precise_unit::operator==((precise_unit *)local_60,(precise_unit *)local_70);
    local_a0 = (internal)!bVar7;
    local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_a0) {
      testing::Message::Message((Message *)&local_a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(local_a8.data_)->line,"Error with false comparison 2 index ",0x24);
      std::ostream::_M_insert<unsigned_long>((ulong)&(local_a8.data_)->line);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_90,&local_a0,(AssertionResult *)"cunit2 == cunit3","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x46a,local_90._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (local_a8.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_a8.data_ + 8))();
      }
    }
    if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_98,local_98);
    }
    local_a0 = (internal)units::precise_unit::operator==(&local_48,(precise_unit *)local_70);
    local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_a0) {
      testing::Message::Message((Message *)&local_a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(local_a8.data_)->line,"Error with inversion ",0x15);
      std::ostream::_M_insert<unsigned_long>((ulong)&(local_a8.data_)->line);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_90,&local_a0,(AssertionResult *)"cunit1 == cunit3","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x46c,local_90._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (local_a8.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_a8.data_ + 8))();
      }
    }
    if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_98,local_98);
    }
    iVar4 = ((int)local_48.base_units_ << 0xd) >> 0x1d;
    if (iVar4 == 3) {
      if (((uint)local_48.base_units_ & 0x3800) == 0x2800) goto LAB_0014763e;
LAB_0014761e:
      local_a0 = (internal)0x0;
LAB_0014765c:
      local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)&local_a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(local_a8.data_)->line,"Error with custom unit detection ",0x21);
      std::ostream::_M_insert<unsigned_long>((ulong)&(local_a8.data_)->line);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_90,&local_a0,
                 (AssertionResult *)"precise::custom::is_custom_count_unit(cunit1.base_units())",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x46d,local_90._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (local_a8.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_a8.data_ + 8))();
      }
    }
    else {
      if ((iVar4 != -3) || (((uint)local_48.base_units_ & 0x3800) != 0x1800)) goto LAB_0014761e;
LAB_0014763e:
      local_a0 = (internal)(((uint)local_48.base_units_ & 0x180000) != 0x100000);
      local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_a0) goto LAB_0014765c;
    }
    if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_98,local_98);
    }
    iVar4 = ((int)local_58._0_4_ << 0xd) >> 0x1d;
    if (iVar4 == 3) {
      if (((uint)local_58._0_4_ & 0x3800) == 0x2800) goto LAB_0014776e;
LAB_0014774e:
      local_a0 = (internal)0x0;
LAB_0014778c:
      local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)&local_a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(local_a8.data_)->line,"Error with custom unit detection of inverse ",
                 0x2c);
      std::ostream::_M_insert<unsigned_long>((ulong)&(local_a8.data_)->line);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_90,&local_a0,
                 (AssertionResult *)"precise::custom::is_custom_count_unit(cunit2.base_units())",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x46f,local_90._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (local_a8.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_a8.data_ + 8))();
      }
    }
    else {
      if ((iVar4 != -3) || (((uint)local_58._0_4_ & 0x3800) != 0x1800)) goto LAB_0014774e;
LAB_0014776e:
      local_a0 = (internal)(((uint)local_58._0_4_ & 0x180000) != 0x100000);
      local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_a0) goto LAB_0014778c;
    }
    if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_98,local_98);
    }
    iVar4 = ((int)local_68._0_4_ << 0xd) >> 0x1d;
    if (iVar4 == 3) {
      if (((uint)local_68._0_4_ & 0x3800) == 0x2800) goto LAB_0014789e;
LAB_0014787e:
      local_a0 = (internal)0x0;
LAB_001478bc:
      local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)&local_a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(local_a8.data_)->line,"Error with custom unit detection inv inv",0x28)
      ;
      std::ostream::_M_insert<unsigned_long>((ulong)&(local_a8.data_)->line);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_90,&local_a0,
                 (AssertionResult *)"precise::custom::is_custom_count_unit(cunit3.base_units())",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x471,local_90._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (local_a8.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_a8.data_ + 8))();
      }
    }
    else {
      if ((iVar4 != -3) || (((uint)local_68._0_4_ & 0x3800) != 0x1800)) goto LAB_0014787e;
LAB_0014789e:
      local_a0 = (internal)(((uint)local_68._0_4_ & 0x180000) != 0x100000);
      local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_a0) goto LAB_001478bc;
    }
    if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_98,local_98);
    }
    lVar5 = lVar5 + 1;
    iVar6 = iVar6 + 0x10000000;
    if (lVar5 == 0x10) {
      return;
    }
  } while( true );
}

Assistant:

TEST(customCountUnits, testAllInv)
{
    for (std::uint16_t ii = 0; ii < 16; ++ii) {
        auto cunit1 = precise::generate_custom_count_unit(ii);
        EXPECT_TRUE(precise::custom::is_custom_count_unit(cunit1.base_units()));
        EXPECT_FALSE(
            precise::custom::is_custom_count_unit_inverted(
                cunit1.base_units()));

        EXPECT_FALSE(precise::custom::is_custom_unit(cunit1.base_units()));
        auto cunit2 = cunit1.inv();
        EXPECT_TRUE(precise::custom::is_custom_count_unit(cunit2.base_units()));
        EXPECT_TRUE(
            precise::custom::is_custom_count_unit_inverted(
                cunit2.base_units()));
        EXPECT_FALSE(precise::custom::is_custom_unit(cunit2.base_units()));
        auto cunit3 = cunit2.inv();
        EXPECT_TRUE(precise::custom::is_custom_count_unit(cunit3.base_units()));
        EXPECT_FALSE(
            precise::custom::is_custom_count_unit_inverted(
                cunit3.base_units()));

        EXPECT_FALSE(cunit1 == cunit2)
            << "Error with false comparison 1 index " << ii;
        EXPECT_FALSE(cunit2 == cunit3)
            << "Error with false comparison 2 index " << ii;
        EXPECT_TRUE(cunit1 == cunit3) << "Error with inversion " << ii;
        EXPECT_TRUE(precise::custom::is_custom_count_unit(cunit1.base_units()))
            << "Error with custom unit detection " << ii;
        EXPECT_TRUE(precise::custom::is_custom_count_unit(cunit2.base_units()))
            << "Error with custom unit detection of inverse " << ii;
        EXPECT_TRUE(precise::custom::is_custom_count_unit(cunit3.base_units()))
            << "Error with custom unit detection inv inv" << ii;
    }
}